

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
          (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *obj)

{
  bool bVar1;
  Entry *pEVar2;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *in_RSI;
  undefined4 *in_RDI;
  Entry *e;
  IteratorBase iit;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffd8;
  TermList in_stack_ffffffffffffffe0;
  
  *in_RDI = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  IteratorBase::IteratorBase((IteratorBase *)&stack0xffffffffffffffd8,in_RSI);
  while( true ) {
    bVar1 = IteratorBase::hasNext((IteratorBase *)&stack0xffffffffffffffd8);
    if (!bVar1) break;
    pEVar2 = IteratorBase::next((IteratorBase *)&stack0xffffffffffffffd8);
    insert(in_stack_ffffffffffffffd8,(uint)((ulong)pEVar2 >> 0x20),in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

DHMap(const DHMap& obj)
  : _timestamp(1), _size(0), _deleted(0), _capacityIndex(0), _capacity(0),
  _nextExpansionOccupancy(0), _entries(0), _afterLast(0)
  {
    typename DHMap::IteratorBase iit(obj);
    while(iit.hasNext()) {
      auto e = iit.next();
      ALWAYS(insert(e->_key,e->_val));
    }
  }